

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  u8 uVar1;
  u8 uVar2;
  char cVar3;
  ushort uVar4;
  MemPage *pPage_00;
  MemPage *pPage_01;
  u8 *pTemp;
  bool bVar5;
  u16 uVar6;
  int iVar7;
  u8 *puVar8;
  uchar *pTmp;
  Pgno n;
  int nCell;
  MemPage *pLeaf;
  undefined1 local_68 [3];
  u8 bPreserve;
  int bSkipnext;
  CellInfo info;
  int iCellDepth;
  int iCellIdx;
  uchar *pCell;
  MemPage *pPage;
  sqlite3 *psStack_30;
  int rc;
  BtShared *pBt;
  Btree *p;
  BtCursor *pBStack_18;
  u8 flags_local;
  BtCursor *pCur_local;
  
  pBt = (BtShared *)pCur->pBtree;
  psStack_30 = pBt->db;
  bVar5 = false;
  p._7_1_ = flags;
  pBStack_18 = pCur;
  if (pCur->eState == '\x03') {
    iVar7 = btreeRestoreCursorPosition(pCur);
    if (iVar7 != 0) {
      return iVar7;
    }
    pPage._4_4_ = 0;
  }
  info.nPayload = (u32)pBStack_18->iPage;
  info._20_4_ = ZEXT24(pBStack_18->ix);
  pPage_00 = pBStack_18->pPage;
  puVar8 = pPage_00->aData;
  uVar4 = pPage_00->maskPage;
  uVar1 = pPage_00->aCellIdx[(int)(info._20_4_ << 1)];
  uVar2 = pPage_00->aCellIdx[(long)(int)(info._20_4_ << 1) + 1];
  if ((pPage_00->nFree < 0) && (iVar7 = btreeComputeFreeSpace(pPage_00), iVar7 != 0)) {
    pCur_local._4_4_ = 0xb;
  }
  else {
    if ((flags & 2) != 0) {
      if (((pPage_00->leaf == '\0') ||
          (iVar7 = pPage_00->nFree,
          uVar6 = cellSizePtr(pPage_00,puVar8 + (int)(uint)(uVar4 & CONCAT11(uVar1,uVar2))),
          (int)((*(u32 *)((long)&psStack_30->flags + 4) << 1) / 3) < (int)(iVar7 + (uint)uVar6 + 2))
          ) || (pPage_00->nCell == 1)) {
        iVar7 = saveCursorKey(pBStack_18);
        if (iVar7 != 0) {
          return iVar7;
        }
        pPage._4_4_ = 0;
      }
      else {
        bVar5 = true;
      }
    }
    if (pPage_00->leaf == '\0') {
      iVar7 = sqlite3BtreePrevious(pBStack_18,0);
      if (iVar7 != 0) {
        return iVar7;
      }
      pPage._4_4_ = 0;
    }
    if ((pBStack_18->curFlags & 0x20) != 0) {
      iVar7 = saveAllCursors((BtShared *)psStack_30,pBStack_18->pgnoRoot,pBStack_18);
      if (iVar7 != 0) {
        return iVar7;
      }
      pPage._4_4_ = 0;
    }
    if (pBStack_18->pKeyInfo == (KeyInfo *)0x0) {
      invalidateIncrblobCursors((Btree *)pBt,pBStack_18->pgnoRoot,(pBStack_18->info).nKey,0);
    }
    pPage._4_4_ = sqlite3PagerWrite(pPage_00->pDbPage);
    pCur_local._4_4_ = pPage._4_4_;
    if (pPage._4_4_ == 0) {
      pPage._4_4_ = clearCell(pPage_00,puVar8 + (int)(uint)(uVar4 & CONCAT11(uVar1,uVar2)),
                              (CellInfo *)local_68);
      dropCell(pPage_00,info._20_4_,(uint)info.pPayload._6_2_,(int *)((long)&pPage + 4));
      if (pPage._4_4_ == 0) {
        if (pPage_00->leaf == '\0') {
          pPage_01 = pBStack_18->pPage;
          if (pPage_01->nFree < 0) {
            iVar7 = btreeComputeFreeSpace(pPage_01);
            if (iVar7 != 0) {
              return iVar7;
            }
            pPage._4_4_ = 0;
          }
          if ((int)info.nPayload < pBStack_18->iPage + -1) {
            pTmp._0_4_ = pBStack_18->apPage[(int)(info.nPayload + 1)]->pgno;
          }
          else {
            pTmp._0_4_ = pBStack_18->pPage->pgno;
          }
          puVar8 = pPage_01->aData +
                   (int)(uint)(pPage_01->maskPage &
                              CONCAT11(pPage_01->aCellIdx[(int)((pPage_01->nCell - 1) * 2)],
                                       pPage_01->aCellIdx
                                       [(long)(int)((pPage_01->nCell - 1) * 2) + 1]));
          if (puVar8 < pPage_01->aData + 4) {
            iVar7 = sqlite3CorruptError(0x119f6);
            return iVar7;
          }
          uVar6 = (*pPage_01->xCellSize)(pPage_01,puVar8);
          pTemp = *(u8 **)(psStack_30->aLimit + 1);
          pPage._4_4_ = sqlite3PagerWrite(pPage_01->pDbPage);
          if (pPage._4_4_ == 0) {
            insertCell(pPage_00,info._20_4_,puVar8 + -4,uVar6 + 4,pTemp,(Pgno)pTmp,
                       (int *)((long)&pPage + 4));
          }
          dropCell(pPage_01,pPage_01->nCell - 1,(uint)uVar6,(int *)((long)&pPage + 4));
          if (pPage._4_4_ != 0) {
            return pPage._4_4_;
          }
        }
        pPage._4_4_ = balance(pBStack_18);
        if ((pPage._4_4_ == 0) && ((int)info.nPayload < (int)pBStack_18->iPage)) {
          releasePageNotNull(pBStack_18->pPage);
          pBStack_18->iPage = pBStack_18->iPage + -1;
          while ((int)info.nPayload < (int)pBStack_18->iPage) {
            cVar3 = pBStack_18->iPage;
            pBStack_18->iPage = cVar3 + -1;
            releasePage(pBStack_18->apPage[cVar3]);
          }
          pBStack_18->pPage = pBStack_18->apPage[pBStack_18->iPage];
          pPage._4_4_ = balance(pBStack_18);
        }
        if (pPage._4_4_ == 0) {
          if (bVar5) {
            pBStack_18->eState = '\x02';
            if ((int)info._20_4_ < (int)(uint)pPage_00->nCell) {
              pBStack_18->skipNext = 1;
            }
            else {
              pBStack_18->skipNext = -1;
              pBStack_18->ix = pPage_00->nCell - 1;
            }
          }
          else {
            pPage._4_4_ = moveToRoot(pBStack_18);
            if ((flags & 2) != 0) {
              btreeReleaseAllCursorPages(pBStack_18);
              pBStack_18->eState = '\x03';
            }
            if (pPage._4_4_ == 0x10) {
              pPage._4_4_ = 0;
            }
          }
        }
        pCur_local._4_4_ = pPage._4_4_;
      }
      else {
        pCur_local._4_4_ = pPage._4_4_;
      }
    }
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState==CURSOR_REQUIRESEEK ){
    rc = btreeRestoreCursorPosition(pCur);
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ) return SQLITE_CORRUPT;

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}